

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadEmbeddedTextures(ColladaParser *this,ZipArchiveIOSystem *zip_archive)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  reference ppVar4;
  undefined8 uVar5;
  pointer pIVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined4 extraout_var;
  uchar *puVar7;
  pointer pIVar8;
  undefined4 extraout_var_00;
  string local_68;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_38;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> image_file;
  Image *image;
  _Self local_20;
  iterator it;
  ZipArchiveIOSystem *zip_archive_local;
  ColladaParser *this_local;
  
  it._M_node = (_Base_ptr)zip_archive;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
       ::begin(&this->mImageLibrary);
  while( true ) {
    image = (Image *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                     ::end(&this->mImageLibrary);
    bVar2 = std::operator!=(&local_20,(_Self *)&image);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
             ::operator*(&local_20);
    image_file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
    _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
         (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
         &ppVar4->second;
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&(ppVar4->second).mImageData);
    iVar1 = it;
    if (bVar2) {
      uVar5 = std::__cxx11::string::c_str();
      pIVar6 = (pointer)(**(code **)(*(long *)iVar1._M_node + 0x20))(iVar1._M_node,uVar5,"rb");
      std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
      unique_ptr<std::default_delete<Assimp::IOStream>,void>
                ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_38,
                 pIVar6);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
      if (bVar2) {
        this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  ((long)image_file._M_t.
                         super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                         .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 0x20);
        pIVar6 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                 operator->(&local_38);
        iVar3 = (*pIVar6->_vptr_IOStream[6])();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (this_00,CONCAT44(extraout_var,iVar3));
        pIVar6 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                 operator->(&local_38);
        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            ((long)image_file._M_t.
                                   super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                                   .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl +
                            0x20));
        pIVar8 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                 operator->(&local_38);
        iVar3 = (*pIVar8->_vptr_IOStream[6])();
        (*pIVar6->_vptr_IOStream[2])(pIVar6,puVar7,CONCAT44(extraout_var_00,iVar3),1);
        BaseImporter::GetExtension
                  (&local_68,
                   (string *)
                   image_file._M_t.
                   super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                   .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl);
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)image_file._M_t.
                          super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                          .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 0x38),
                   (string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)image_file._M_t.
                                        super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                                        .super__Head_base<0UL,_Assimp::IOStream_*,_false>.
                                        _M_head_impl + 0x38),"jpeg");
        if (bVar2) {
          std::__cxx11::string::operator=
                    ((string *)
                     ((long)image_file._M_t.
                            super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                            .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 0x38),
                     "jpg");
        }
      }
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_38);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Assimp::ColladaParser::ReadEmbeddedTextures(ZipArchiveIOSystem& zip_archive)
{
    // Attempt to load any undefined Collada::Image in ImageLibrary
    for (ImageLibrary::iterator it = mImageLibrary.begin(); it != mImageLibrary.end(); ++it) {
        Collada::Image &image = (*it).second;

        if (image.mImageData.empty()) {
            std::unique_ptr<IOStream> image_file(zip_archive.Open(image.mFileName.c_str()));
            if (image_file) {
                image.mImageData.resize(image_file->FileSize());
                image_file->Read(image.mImageData.data(), image_file->FileSize(), 1);
                image.mEmbeddedFormat = BaseImporter::GetExtension(image.mFileName);
                if (image.mEmbeddedFormat == "jpeg") {
                    image.mEmbeddedFormat = "jpg";
                }
            }
        }
    }
}